

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::interval_t,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  ulong in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  interval_t *rdata_1;
  ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> **sdata_1;
  AggregateFinalizeData finalize_data;
  interval_t *rdata;
  ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> **sdata;
  ulong local_80;
  AggregateFinalizeData local_78;
  interval_t *local_60;
  ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> **local_58;
  AggregateFinalizeData *in_stack_ffffffffffffffb0;
  AggregateInputData *in_stack_ffffffffffffffb8;
  ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>
  *in_stack_ffffffffffffffc0;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    ConstantVector::
    GetData<duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>*>
              ((Vector *)0xb30350);
    ConstantVector::GetData<duckdb::interval_t>((Vector *)0xb3035f);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffffb0,in_RDX,in_RSI);
    ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
    Finalize<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>>
              (in_stack_ffffffffffffffc0,(interval_t *)in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    local_58 = FlatVector::
               GetData<duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>*>
                         ((Vector *)0xb303ad);
    local_60 = FlatVector::GetData<duckdb::interval_t>((Vector *)0xb303bc);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,in_RDX,in_RSI);
    for (local_80 = 0; local_80 < in_RCX; local_80 = local_80 + 1) {
      local_78.result_idx = local_80 + in_R8;
      ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
      Finalize<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>>
                (in_stack_ffffffffffffffc0,(interval_t *)in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}